

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

size_t units::findOperatorSep(string *ustring,string *operators)

{
  int iVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int index;
  size_type sep;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  size_type local_18;
  
  __str = in_RSI;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffcf,
                                     CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)))
  ;
  local_18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str
                          ,(size_type)in_RSI);
  while( true ) {
    uVar3 = false;
    if ((local_18 != 0xffffffffffffffff) && (uVar3 = false, local_18 != 0)) {
      pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffce = true;
      uVar3 = in_stack_ffffffffffffffce;
      if (*pvVar2 != ')') {
        pvVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffce = true;
        uVar3 = in_stack_ffffffffffffffce;
        if (*pvVar2 != '}') {
          pvVar2 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          in_stack_ffffffffffffffce = *pvVar2 == ']';
          uVar3 = in_stack_ffffffffffffffce;
        }
      }
    }
    if ((bool)uVar3 == false) break;
    iVar1 = (int)local_18 + -1;
    in_stack_ffffffffffffffc0 = in_RDI;
    pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_RDI,in_stack_ffffffffffffffb8);
    getMatchCharacter(*pvVar2);
    segmentcheckReverse((string *)__str,(char)((ulong)in_RSI >> 0x38),
                        (int *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffffce,
                                                       in_stack_ffffffffffffffc8)));
    if (iVar1 < 1) {
      in_stack_ffffffffffffffb8 = 0xffffffffffffffff;
      local_18 = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffb8 =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str,
                        (size_type)in_RSI);
      local_18 = in_stack_ffffffffffffffb8;
    }
  }
  if (local_18 == 0) {
    local_18 = 0xffffffffffffffff;
  }
  return local_18;
}

Assistant:

static size_t findOperatorSep(const std::string& ustring, std::string operators)
{
    operators.append(")}]");
    auto sep = ustring.find_last_of(operators);

    while (
        sep != std::string::npos && sep > 0 &&
        (ustring[sep] == ')' || ustring[sep] == '}' || ustring[sep] == ']')) {
        int index = static_cast<int>(sep) - 1;
        segmentcheckReverse(ustring, getMatchCharacter(ustring[sep]), index);
        sep = (index > 0) ? ustring.find_last_of(operators, index) :
                            std::string::npos;
    }
    if (sep == 0) {
        // this should not happen
        // LCOV_EXCL_START
        sep = std::string::npos;
        // LCOV_EXCL_STOP
    }
    return sep;
}